

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

MemPage * btreePageFromDbPage(DbPage *pDbPage,Pgno pgno,BtShared *pBt)

{
  u8 uVar1;
  MemPage *pMVar2;
  u8 *puVar3;
  MemPage *pPage;
  BtShared *pBt_local;
  Pgno pgno_local;
  DbPage *pDbPage_local;
  
  pMVar2 = (MemPage *)sqlite3PagerGetExtra(pDbPage);
  if (pgno != pMVar2->pgno) {
    puVar3 = (u8 *)sqlite3PagerGetData(pDbPage);
    pMVar2->aData = puVar3;
    pMVar2->pDbPage = pDbPage;
    pMVar2->pBt = pBt;
    pMVar2->pgno = pgno;
    uVar1 = '\0';
    if (pgno == 1) {
      uVar1 = 'd';
    }
    pMVar2->hdrOffset = uVar1;
  }
  return pMVar2;
}

Assistant:

static MemPage *btreePageFromDbPage(DbPage *pDbPage, Pgno pgno, BtShared *pBt){
  MemPage *pPage = (MemPage*)sqlite3PagerGetExtra(pDbPage);
  if( pgno!=pPage->pgno ){
    pPage->aData = sqlite3PagerGetData(pDbPage);
    pPage->pDbPage = pDbPage;
    pPage->pBt = pBt;
    pPage->pgno = pgno;
    pPage->hdrOffset = pgno==1 ? 100 : 0;
  }
  assert( pPage->aData==sqlite3PagerGetData(pDbPage) );
  return pPage; 
}